

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O2

void __thiscall CPP::WriteInitialization::Item::addChild(Item *this,Item *child)

{
  TemporaryVariableGeneratorPolicy TVar1;
  Item *pIVar2;
  
  QList<CPP::WriteInitialization::Item_*>::append(&this->m_children,child);
  child->m_parent = this;
  while (pIVar2 = this, pIVar2 != (Item *)0x0) {
    QSet<QString>::unite(&(pIVar2->m_setupUiData).directives,&(child->m_setupUiData).directives);
    QSet<QString>::unite
              (&(pIVar2->m_retranslateUiData).directives,&(child->m_retranslateUiData).directives);
    TVar1 = (child->m_setupUiData).policy;
    if ((int)(pIVar2->m_setupUiData).policy < (int)TVar1) {
      (pIVar2->m_setupUiData).policy = TVar1;
    }
    TVar1 = (child->m_retranslateUiData).policy;
    if ((int)(pIVar2->m_retranslateUiData).policy < (int)TVar1) {
      (pIVar2->m_retranslateUiData).policy = TVar1;
    }
    child = pIVar2;
    this = pIVar2->m_parent;
  }
  return;
}

Assistant:

void WriteInitialization::Item::addChild(Item *child)
{
    m_children << child;
    child->m_parent = this;

    Item *c = child;
    Item *p = this;
    while (p) {
        p->m_setupUiData.directives |= c->m_setupUiData.directives;
        p->m_retranslateUiData.directives |= c->m_retranslateUiData.directives;
        if (p->m_setupUiData.policy < c->m_setupUiData.policy)
            p->m_setupUiData.policy = c->m_setupUiData.policy;
        if (p->m_retranslateUiData.policy < c->m_retranslateUiData.policy)
            p->m_retranslateUiData.policy = c->m_retranslateUiData.policy;
        c = p;
        p = p->m_parent;
    }
}